

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ChromeLatencyInfo_ComponentInfo::ChromeLatencyInfo_ComponentInfo
          (ChromeLatencyInfo_ComponentInfo *this)

{
  ChromeLatencyInfo_ComponentInfo *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ChromeLatencyInfo_ComponentInfo_009c1ed8;
  this->component_type_ = ChromeLatencyInfo_LatencyComponentType_COMPONENT_UNSPECIFIED;
  this->time_us_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<3UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

ChromeLatencyInfo_ComponentInfo::ChromeLatencyInfo_ComponentInfo() = default;